

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

bool __thiscall FMapInfoParser::ParseCloseBrace(FMapInfoParser *this)

{
  FMapInfoParser *this_local;
  
  if (this->format_type == 2) {
    this_local._7_1_ = FScanner::Compare(&this->sc,"}");
  }
  else {
    FScanner::UnGet(&this->sc);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FMapInfoParser::ParseCloseBrace()
{
	if (format_type == FMT_New)
	{
		return sc.Compare("}");
	}
	else
	{
		// We have to assume that the next keyword
		// starts a new top level block
		sc.UnGet();
		return true;
	}
}